

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strnlen_s.c
# Opt level: O0

rsize_t strnlen_s(char *dest,rsize_t dmax)

{
  ulong in_RSI;
  char *in_RDI;
  rsize_t count;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  char *in_stack_ffffffffffffffe0;
  ulong local_18;
  char *local_10;
  rsize_t local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = 0;
  }
  else if (in_RSI == 0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffe0,
               (void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0);
    local_8 = 0;
  }
  else if (in_RSI < 0x1001) {
    local_8 = 0;
    local_18 = in_RSI;
    for (local_10 = in_RDI; *local_10 != '\0' && local_18 != 0; local_10 = local_10 + 1) {
      local_8 = local_8 + 1;
      local_18 = local_18 - 1;
    }
  }
  else {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffe0,
               (void *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),0);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

rsize_t
strnlen_s (const char *dest, rsize_t dmax)
{
    rsize_t count;

    if (dest == NULL) {
        return RCNEGATE(0);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strnlen_s: dmax is 0",
                   NULL, ESZEROL);
        return RCNEGATE(0);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strnlen_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return RCNEGATE(0);
    }

    count = 0;
    while (*dest && dmax) {
        count++;
        dmax--;
        dest++;
    }

    return RCNEGATE(count);
}